

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::JsonReporter::~JsonReporter(JsonReporter *this)

{
  char local_19;
  
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener =
       (_func_int **)&PTR__JsonReporter_001afb48;
  endListing(this);
  std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::pop_back
            (&(this->m_objectWriters).c);
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::pop_back
            (&(this->m_writers).c);
  local_19 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,&local_19,1);
  std::ostream::flush();
  std::_Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::
  ~_Deque_base((_Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>
                *)&this->m_writers);
  std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>::~deque
            (&(this->m_arrayWriters).c);
  std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::~deque
            (&(this->m_objectWriters).c);
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener =
       (_func_int **)&PTR__TeamCityReporter_001afcf0;
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector
            (&(this->super_StreamingReporterBase).m_sectionStack);
  ReporterBase::~ReporterBase((ReporterBase *)this);
  return;
}

Assistant:

JsonReporter::~JsonReporter() {
        endListing();
        // TODO: Ensure this closes the top level object, add asserts
        assert( m_writers.size() == 1 && "Only the top level object should be open" );
        assert( m_writers.top() == Writer::Object );
        endObject();
        m_stream << '\n' << std::flush;
        assert( m_writers.empty() );
    }